

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

NetlistVariableDeclaration * __thiscall
netlist::Netlist::lookupVariable(Netlist *this,string_view hierarchicalPath)

{
  bool bVar1;
  pointer this_00;
  undefined8 in_RDI;
  borrowed_iterator_t<netlist::Netlist_&> it;
  anon_class_8_1_9ed3c1cc compareNode;
  DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge> *in_stack_ffffffffffffffa8;
  __normal_iterator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  NetlistVariableDeclaration *pNVar2;
  __normal_iterator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
  local_28;
  undefined1 *local_20;
  undefined1 local_10 [16];
  
  local_20 = local_10;
  local_28._M_current =
       (unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_> *)
       std::ranges::__find_if_fn::
       operator()<netlist::Netlist_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_netlist_tests____include_Netlist_h:448:28)>
                 ((__find_if_fn *)&std::ranges::find_if,in_RDI,local_20);
  DirectedGraph<netlist::NetlistNode,_netlist::NetlistEdge>::end(in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::
          operator==<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
                    (in_stack_ffffffffffffffb0,
                     (__normal_iterator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pNVar2 = (NetlistVariableDeclaration *)0x0;
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_*,_std::vector<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>,_std::allocator<std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>_>_>_>
    ::operator->(&local_28);
    this_00 = std::unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>::get
                        ((unique_ptr<netlist::NetlistNode,_std::default_delete<netlist::NetlistNode>_>
                          *)in_stack_ffffffffffffffb0);
    pNVar2 = NetlistNode::as<netlist::NetlistVariableDeclaration>(this_00);
  }
  return pNVar2;
}

Assistant:

NetlistVariableDeclaration* lookupVariable(std::string_view hierarchicalPath) {
        auto compareNode = [&hierarchicalPath](const std::unique_ptr<NetlistNode>& node) {
            return node->kind == NodeKind::VariableDeclaration &&
                   node->as<NetlistVariableDeclaration>().hierarchicalPath == hierarchicalPath;
        };
        auto it = std::ranges::find_if(*this, compareNode);
        return it != end() ? &it->get()->as<NetlistVariableDeclaration>() : nullptr;
    }